

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_util.cpp
# Opt level: O3

bool BmsUtil::wchar_to_utf8(wchar_t *org,char *out,int maxlen)

{
  iconv_t __cd;
  size_t sVar1;
  bool bVar2;
  char *but_out_iconv;
  size_t len_out;
  size_t len_in;
  ICONVCHR *buf_iconv;
  char *local_50;
  size_t local_48;
  size_t local_40;
  wchar_t *local_38;
  
  __cd = iconv_open("UTF-8","UTF-16LE");
  if (__cd == (iconv_t)0xffffffffffffffff) {
    bVar2 = false;
  }
  else {
    *out = '\0';
    local_50 = out;
    local_38 = org;
    local_40 = wcslen(org);
    local_40 = local_40 * 2;
    local_48 = (size_t)maxlen;
    sVar1 = iconv(__cd,(char **)&local_38,&local_40,&local_50,&local_48);
    bVar2 = (sVar1 & 0xffffffff) != 0xffffffff;
    if (bVar2) {
      *local_50 = '\0';
    }
  }
  return bVar2;
}

Assistant:

bool BmsUtil::wchar_to_utf8(const wchar_t *org, char *out, int maxlen)
{
	//
	// should not use convert_to_utf8()
	// because WCHAR is a little different from UTF8 (\0 bytes included)
	//
	iconv_t cd = iconv_open("UTF-8", "UTF-16LE");
	if (cd == (void*)-1)
		return false;

	out[0] = 0;
	ICONVCHR *buf_iconv = (ICONVCHR*)org;
	char *but_out_iconv = (char*)out;
	size_t len_in = wcslen(org) * 2;
	size_t len_out = maxlen;

	int r = iconv(cd, &buf_iconv, &len_in, &but_out_iconv, &len_out);
	if ((int)r == -1)
		return false;
	*but_out_iconv = 0;

	return true;
}